

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XDataAllocator.cpp
# Opt level: O2

void __thiscall Memory::XDataAllocator::XDataAllocator(XDataAllocator *this,BYTE *address,uint size)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  
  (this->super_SecondaryAllocator)._vptr_SecondaryAllocator = (_func_int **)&PTR_Alloc_01376ea0;
  this->start = address;
  this->current = address;
  this->size = size;
  this->freeList = (XDataAllocationEntry *)0x0;
  if (size == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/amd64/XDataAllocator.cpp"
                       ,0x19,"(size > 0)","size > 0");
    if (!bVar2) goto LAB_006c05f5;
    *puVar3 = 0;
  }
  if (address == (BYTE *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/amd64/XDataAllocator.cpp"
                       ,0x1a,"(address != nullptr)","address != nullptr");
    if (!bVar2) {
LAB_006c05f5:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  return;
}

Assistant:

XDataAllocator::XDataAllocator(BYTE* address, uint size) :
    freeList(nullptr),
    start(address),
    current(address),
    size(size)
{
    Assert(size > 0);
    Assert(address != nullptr);
}